

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  sas_client *client_00;
  rxc_sink *sink;
  char *pcVar2;
  char *pcVar3;
  char *addr;
  int port;
  sas_client *client;
  int err;
  int c;
  int option_index;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _c = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    err = 0;
    iVar1 = getopt_long((int)argv_local,_c,"h",long_options,&err);
    if (iVar1 == -1) break;
    if (iVar1 != 0) {
      if (iVar1 == 0x3f) {
        print_usage(*_c);
        argv_local._4_4_ = 1;
      }
      else {
        if (iVar1 != 0x68) {
          abort();
        }
        print_usage(*_c);
        argv_local._4_4_ = 0;
      }
      return argv_local._4_4_;
    }
  }
  if ((int)argv_local < 3) {
    print_usage(*_c);
    return 1;
  }
  client_00 = sas_client_alloc();
  if (client_00 == (sas_client *)0x0) {
    sas_log("[ERROR] Failed to allocate server\n");
    return 1;
  }
  sink = sas_drivers_ignore();
  iVar1 = sas_client_init(client_00,sink);
  if (iVar1 != 0) {
    pcVar2 = strerror(iVar1);
    sas_log("[ERROR] Failed to initialize client: %s\n",pcVar2);
    sas_client_dealloc(client_00);
    return 1;
  }
  pcVar2 = _c[1];
  iVar1 = sas_client_connect_hostname(client_00,pcVar2,0xd80);
  if (iVar1 != 0) {
    pcVar2 = _c[1];
    pcVar3 = gai_strerror(iVar1);
    sas_log("[ERROR] Failed to connect to address %s: %s\n",pcVar2,pcVar3);
    sas_client_dealloc(client_00);
    return 1;
  }
  sas_log("[INFO] Connected to address %s:%d\n",pcVar2,0xd80);
  sas_log("[INFO] Requesting %s\n",_c[2]);
  iVar1 = sas_client_receive(client_00,_c[2]);
  if (iVar1 != 0) {
    pcVar2 = strerror(iVar1);
    sas_log("[ERROR] Failed to receive: %s\n",pcVar2);
    sas_client_dealloc(client_00);
    return 1;
  }
  sas_client_dealloc(client_00);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    /* Parse command line options */
    while (1) {
        int option_index = 0;
        int c = getopt_long(argc, argv, "h", long_options, &option_index);

        if (c == -1) {
            break;
        }

        switch (c) {
            case 0:
                if (long_options[option_index].flag != 0)
                    break;
                break;
            case 'h':
                print_usage(argv[0]);
                return EXIT_SUCCESS;
            case '?':
                print_usage(argv[0]);
                return EXIT_FAILURE;
            default:
                abort();
        }
    }

    if (argc <= 2) {
        print_usage(argv[0]);
        return EXIT_FAILURE;
    }

    int err;
    struct sas_client *client = sas_client_alloc();

    if (!client) {
        sas_log(LOG_ERR "Failed to allocate server\n");
        return EXIT_FAILURE;
    }

    if ((err = sas_client_init(client, sas_drivers_ignore())) != 0) {
        sas_log(LOG_ERR "Failed to initialize client: %s\n", strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }

    int port = 3456;
    char *addr = argv[1];

    if ((err = sas_client_connect_hostname(client, addr, port)) != 0) {
        sas_log(LOG_ERR "Failed to connect to address %s: %s\n", argv[1], gai_strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }

    sas_log(LOG_INFO "Connected to address %s:%d\n", addr, port);
    sas_log(LOG_INFO "Requesting %s\n", argv[2]);
    if ((err = sas_client_receive(client, argv[2])) != 0) {
        sas_log(LOG_ERR "Failed to receive: %s\n", strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }
    sas_client_dealloc(client);

    return EXIT_SUCCESS;
}